

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall re2::Regexp::ParseState::DoLeftParen(ParseState *this,StringPiece *name)

{
  char *pcVar1;
  int iVar2;
  Regexp *this_00;
  string *psVar3;
  
  this_00 = (Regexp *)operator_new(0x28);
  Regexp(this_00,kRegexpCharClass|kRegexpEmptyMatch,this->flags_);
  iVar2 = this->ncap_ + 1;
  this->ncap_ = iVar2;
  (this_00->field_7).field_0.max_ = iVar2;
  pcVar1 = name->ptr_;
  if (pcVar1 != (char *)0x0) {
    psVar3 = (string *)operator_new(0x20);
    iVar2 = name->length_;
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar3,pcVar1,pcVar1 + iVar2);
    (this_00->field_7).the_union_[1] = psVar3;
  }
  PushRegexp(this,this_00);
  return true;
}

Assistant:

bool Regexp::ParseState::DoLeftParen(const StringPiece& name) {
  Regexp* re = new Regexp(kLeftParen, flags_);
  re->cap_ = ++ncap_;
  if (name.data() != NULL)
    re->name_ = new string(name.as_string());
  return PushRegexp(re);
}